

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O1

int queue_5_3::deQueue(sq_queue *q,int *e)

{
  int iVar1;
  string local_38;
  
  if (q->front == q->rear) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,anon_var_dwarf_1cf5,anon_var_dwarf_1cf5 + 6);
    errCode(&local_38,0);
    iVar1 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      iVar1 = 0;
    }
  }
  else {
    *e = q->data[q->front];
    q->front = (q->front + 1) % q->ssize;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int deQueue(sq_queue &q, int &e) {
        if (q.front == q.rear)
            return errCode("空队", 0);

        e = q.data[q.front];
        q.front = (q.front + 1) % q.ssize;
        return 1;
    }